

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

bool __thiscall
ON_AerialPhotoImage::GetViewProjection
          (ON_AerialPhotoImage *this,ON_BoundingBox target_bbox,ON_Viewport *viewport)

{
  ON_3dPoint *this_00;
  int port_right;
  int port_top;
  undefined8 uVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double bbox_far;
  double bbox_near;
  ON_3dPoint camera_location;
  ON_Plane camera_plane;
  ON_Viewport vp;
  ON_Xform camera_rotation;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3c0;
  ON_3dPoint local_3b8;
  ON_SHA1_Hash *local_3a0;
  ON_3dPoint local_398;
  ON_Plane local_378;
  undefined1 local_2f8 [560];
  ON__UINT8 local_c8 [8];
  ON__UINT8 aOStack_c0 [8];
  ON__UINT8 local_b8 [8];
  ON_Xform local_b0;
  
  bVar7 = 0;
  ON_Object::operator=((ON_Object *)viewport,(ON_Object *)&ON_Viewport::DefaultTopViewYUp);
  memcpy(&viewport->m_bValidCamera,&ON_Viewport::DefaultTopViewYUp.m_bValidCamera,0x220);
  *(undefined4 *)((viewport->m_projection_content_sha1).m_digest + 0x10) =
       ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._16_4_;
  uVar1 = ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._8_8_;
  *(undefined8 *)(viewport->m_projection_content_sha1).m_digest =
       ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._0_8_;
  *(undefined8 *)((viewport->m_projection_content_sha1).m_digest + 8) = uVar1;
  port_right = this->m_image_width_pixels;
  port_top = this->m_image_height_pixels;
  if (port_top < 1 || port_right < 1) {
    return false;
  }
  bVar3 = ON_AerialPhotoImageFrustum::IsSet(&this->m_image_frustum);
  if (!bVar3) {
    return false;
  }
  this_00 = &(this->m_camera_position).m_location;
  bVar3 = ON_3dPoint::IsValid(this_00);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_AerialPhotoCameraPosition::OrientationIsSet(&this->m_camera_position);
  if (!bVar3) {
    return false;
  }
  local_398.z = (this->m_camera_position).m_location.z;
  local_398.x = this_00->x;
  local_398.y = (this->m_camera_position).m_location.y;
  bVar3 = ON_3dPoint::IsValid(this_00);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_3dPoint::IsValid(&local_398);
  if (!bVar3) {
    return false;
  }
  ON_Xform::ON_Xform(&local_b0);
  pOVar5 = &(this->m_camera_position).m_orientation_rotation;
  pOVar6 = &local_b0;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
    pOVar5 = (ON_Xform *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
    pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  if (((this->m_camera_position).m_status & 2) == 0) {
    return false;
  }
  bVar3 = ON_Xform::IsValid(&local_b0);
  if (!bVar3) {
    return false;
  }
  ON_Plane::ON_Plane(&local_378);
  local_378.xaxis.x = (this->m_camera_position).m_orientation_rotation.m_xform[0][0];
  local_378.xaxis.y = (this->m_camera_position).m_orientation_rotation.m_xform[1][0];
  local_378.xaxis.z = (this->m_camera_position).m_orientation_rotation.m_xform[2][0];
  local_378.yaxis.x = (this->m_camera_position).m_orientation_rotation.m_xform[0][1];
  local_378.yaxis.y = (this->m_camera_position).m_orientation_rotation.m_xform[1][1];
  local_378.yaxis.z = (this->m_camera_position).m_orientation_rotation.m_xform[2][1];
  local_378.zaxis.x = (this->m_camera_position).m_orientation_rotation.m_xform[0][2];
  local_378.zaxis.y = (this->m_camera_position).m_orientation_rotation.m_xform[1][2];
  local_378.zaxis.z = (this->m_camera_position).m_orientation_rotation.m_xform[2][2];
  if (((this->m_camera_position).m_status & 2) != 0) {
    local_378.origin.z = local_398.z;
    local_378.origin.x = local_398.x;
    local_378.origin.y = local_398.y;
    ON_Plane::UpdateEquation(&local_378);
    local_2f8._0_8_ = *(undefined8 *)&(this->m_camera_position).m_unit_system;
    local_2f8._8_8_ = (this->m_camera_position).m_unit_system.m_meters_per_custom_unit;
    ON_wString::ON_wString
              ((ON_wString *)(local_2f8 + 0x10),
               &(this->m_camera_position).m_unit_system.m_custom_unit_name);
    dVar9 = ON::UnitScale(&(this->m_image_frustum).m_unit_system,(ON_UnitSystem *)local_2f8);
    ON_wString::~ON_wString((ON_wString *)(local_2f8 + 0x10));
    bVar3 = ON_IsValid(dVar9);
    if (0.0 < dVar9 && bVar3) {
      local_400 = (this->m_image_frustum).m_height * dVar9;
      bVar3 = ON_IsValid(local_400);
      if (bVar3 && 0.0 < local_400) {
        local_3a0 = &viewport->m_projection_content_sha1;
        local_3f8 = (this->m_image_frustum).m_corners[0].x;
        local_3f0 = (this->m_image_frustum).m_corners[0].y;
        lVar4 = 0;
        local_3e8 = local_3f8;
        local_3e0 = local_3f0;
        do {
          dVar10 = *(double *)((long)&(this->m_image_frustum).m_corners[1].x + lVar4);
          dVar2 = dVar10;
          if ((local_3e8 <= dVar10) && (dVar2 = local_3e8, local_3f8 < dVar10)) {
            local_3f8 = dVar10;
          }
          local_3e8 = dVar2;
          dVar10 = *(double *)((long)&(this->m_image_frustum).m_corners[1].y + lVar4);
          dVar2 = dVar10;
          if ((local_3e0 <= dVar10) && (dVar2 = local_3e0, local_3f0 < dVar10)) {
            local_3f0 = dVar10;
          }
          local_3e0 = dVar2;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x30);
        ON_Viewport::ON_Viewport((ON_Viewport *)local_2f8);
        bVar3 = ON_Viewport::SetProjection((ON_Viewport *)local_2f8,perspective_view);
        if (bVar3) {
          local_3b8.z = (this->m_camera_position).m_location.z;
          local_3b8.x = this_00->x;
          local_3b8.y = (this->m_camera_position).m_location.y;
          bVar3 = ON_Viewport::SetCameraLocation((ON_Viewport *)local_2f8,&local_3b8);
          if (!bVar3) goto LAB_00567ec9;
          ON_3dVector::operator-((ON_3dVector *)&local_3b8,&local_378.zaxis);
          bVar3 = ON_Viewport::SetCameraDirection
                            ((ON_Viewport *)local_2f8,(ON_3dVector *)&local_3b8);
          if ((!bVar3) ||
             (bVar3 = ON_Viewport::SetCameraUp((ON_Viewport *)local_2f8,&local_378.yaxis), !bVar3))
          goto LAB_00567ec9;
          local_3d8 = local_400 * 128.0;
          local_3e8 = local_3e8 * dVar9;
          local_3f8 = local_3f8 * dVar9;
          local_3e0 = local_3e0 * dVar9;
          local_3f0 = local_3f0 * dVar9;
          bVar3 = ON_Viewport::SetFrustum
                            ((ON_Viewport *)local_2f8,local_3e8,local_3f8,local_3e0,local_3f0,
                             local_400,local_3d8);
          if ((!bVar3) ||
             (bVar3 = ON_Viewport::SetScreenPort
                                ((ON_Viewport *)local_2f8,0,port_right,0,port_top,0,0), !bVar3))
          goto LAB_00567ec9;
          local_3b8.x = -1.23432101234321e+308;
          local_3c0 = -1.23432101234321e+308;
          bVar3 = ON_Viewport::GetBoundingBoxDepth
                            ((ON_Viewport *)local_2f8,target_bbox,&local_3b8.x,&local_3c0,false);
          if (bVar3) {
            bVar3 = ON_IsValid(local_3b8.x);
            if (bVar3 && local_400 < local_3b8.x) {
              dVar9 = 1.0;
              do {
                dVar10 = dVar9;
                dVar9 = dVar10 + dVar10;
              } while (local_400 * (dVar10 + dVar10) <= local_3b8.x);
              if (2.0 <= dVar10) {
                local_400 = local_400 * dVar10;
                local_3e8 = local_3e8 * dVar10;
                local_3f8 = local_3f8 * dVar10;
                local_3e0 = local_3e0 * dVar10;
                local_3f0 = local_3f0 * dVar10;
                local_3d8 = local_400 * 1.0625;
              }
            }
            bVar3 = ON_IsValid(local_3c0);
            if ((bVar3) && (local_3d8 < local_3c0)) {
              uVar8 = -(ulong)(local_3c0 * 1.0625 <= local_400 * 67108864.0);
              local_3d8 = (double)(~uVar8 & (ulong)(local_400 * 67108864.0) |
                                  (ulong)(local_3c0 * 1.0625) & uVar8);
            }
            bVar3 = ON_Viewport::SetFrustum
                              ((ON_Viewport *)local_2f8,local_3e8,local_3f8,local_3e0,local_3f0,
                               local_400,local_3d8);
            if (!bVar3) goto LAB_00567ec9;
          }
          bVar3 = ON_Viewport::IsValid((ON_Viewport *)local_2f8,(ON_TextLog *)0x0);
          if (!bVar3) goto LAB_00567ec9;
          ON_Object::operator=((ON_Object *)viewport,(ON_Object *)local_2f8);
          memcpy(&viewport->m_bValidCamera,local_2f8 + 0x10,0x220);
          *(ON__UINT8 (*) [8])local_3a0->m_digest = local_c8;
          *(ON__UINT8 (*) [8])(local_3a0->m_digest + 8) = aOStack_c0;
          *(undefined4 *)(local_3a0->m_digest + 0x10) = local_b8._0_4_;
          bVar3 = true;
        }
        else {
LAB_00567ec9:
          bVar3 = false;
        }
        ON_Object::~ON_Object((ON_Object *)local_2f8);
        goto LAB_00567eba;
      }
    }
  }
  bVar3 = false;
LAB_00567eba:
  ON_Plane::~ON_Plane(&local_378);
  return bVar3;
}

Assistant:

bool ON_AerialPhotoImage::GetViewProjection( 
  ON_BoundingBox target_bbox,
  ON_Viewport& viewport
  ) const
{
  viewport = ON_Viewport::DefaultTopViewYUp;

  if ( !this->ImageSizeIsSet() )
    return false;

  const int image_width_pixels   = m_image_width_pixels;
  const int image_height_pixels = m_image_height_pixels;

  const ON_AerialPhotoImageFrustum& pg_if( m_image_frustum );
  if ( !pg_if.IsSet() )
    return false;

  const ON_AerialPhotoCameraPosition& pg_cp( m_camera_position );
  if ( !pg_cp.LocationIsSet() )
    return false;
  if ( !pg_cp.OrientationIsSet() )
    return false;

  ON_3dPoint camera_location;
  if ( !pg_cp.GetLocation(camera_location) || !camera_location.IsValid() )
    return false;

  ON_Xform camera_rotation;
  if (    !pg_cp.GetOrientationRotation(camera_rotation) 
       || !camera_rotation.IsValid() 
     )
    return false;

  ON_Plane camera_plane;
  if (!pg_cp.GetOrientationFrame(camera_plane.xaxis,camera_plane.yaxis,camera_plane.zaxis))
    return false;
  camera_plane.origin = camera_location;
  camera_plane.UpdateEquation();

  const double frustum_to_position_unit_scale = ON::UnitScale( pg_if.m_unit_system, pg_cp.UnitSystem() );
  if (    !ON_IsValid(frustum_to_position_unit_scale) 
       || !(frustum_to_position_unit_scale > 0.0) 
     )
    return false;

  // The values of frus_near and frus_far are adjusted later
  // so the view's frustum contains the region in target_bbox.

  double frus_near = pg_if.m_height*frustum_to_position_unit_scale;
  if ( !ON_IsValid(frus_near) || !(frus_near > 0.0) )
    return false;

  double frus_far = 128.0*frus_near; 

  double frus_left, frus_right;
  double frus_bottom, frus_top;
  frus_left = frus_right = pg_if.m_corners[0].x;
  frus_bottom = frus_top = pg_if.m_corners[0].y;
  for ( size_t i = 1; i < sizeof(pg_if.m_corners)/sizeof(pg_if.m_corners[0]); i++ )
  {
    if ( pg_if.m_corners[i].x < frus_left )
      frus_left = pg_if.m_corners[i].x;
    else if ( pg_if.m_corners[i].x > frus_right )
      frus_right = pg_if.m_corners[i].x;
    if ( pg_if.m_corners[i].y < frus_bottom )
      frus_bottom = pg_if.m_corners[i].y;
    else if ( pg_if.m_corners[i].y > frus_top )
      frus_top = pg_if.m_corners[i].y;
  }
  frus_left   *= frustum_to_position_unit_scale;
  frus_right  *= frustum_to_position_unit_scale;
  frus_bottom *= frustum_to_position_unit_scale;
  frus_top    *= frustum_to_position_unit_scale;
  
  bool rc = false;

  ON_Viewport vp;
  for(;;)
  {
    if ( !vp.SetProjection( ON::perspective_view ) )
      break;
  
    if ( !vp.SetCameraLocation( pg_cp.Location() ) )
      break;
  
    if ( !vp.SetCameraDirection( -camera_plane.zaxis ) )
      break;
  
    if ( !vp.SetCameraUp( camera_plane.yaxis ) )
      break;

    if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
      break;
    
    if ( !vp.SetScreenPort(0,image_width_pixels,0,image_height_pixels) )
      break;

    double bbox_near = ON_UNSET_VALUE;
    double bbox_far  = ON_UNSET_VALUE;
    if ( vp.GetBoundingBoxDepth(target_bbox,&bbox_near,&bbox_far,false) )
    {
      if ( frus_near > 0.0 && ON_IsValid(bbox_near) && frus_near < bbox_near )
      {
        double s = 1.0;
        while ( 2.0*s*frus_near <= bbox_near )
          s *= 2.0;

        if ( s >= 2.0 )
        {
          frus_near   *= s;
          frus_left   *= s;
          frus_right  *= s;
          frus_bottom *= s;
          frus_top    *= s;
          frus_far = 1.0625*frus_near;
        }
      }
            
      if ( ON_IsValid(bbox_far) && frus_far < bbox_far )
      {
        frus_far = 1.0625*bbox_far;
        const double max_frus_far = 67108864.0*frus_near; // 2^26 * frus_near
        if ( !(frus_far <= max_frus_far) )
          frus_far = max_frus_far;
      }

      if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
        break;
    }

    rc = vp.IsValid() ? true : false;
    if ( rc )
      viewport = vp;

    break;
  }

  return rc;
}